

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ForkBranch<capnproto_test::capnp::test::TestInterface::Client>::get
          (ForkBranch<capnproto_test::capnp::test::TestInterface::Client> *this,
          ExceptionOrValue *output)

{
  NullableValue<kj::Exception> *other;
  undefined1 local_30 [24];
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (other[1].isSet == true) {
    capnproto_test::capnp::test::TestInterface::Client::Client
              ((Client *)local_30,(Client *)&other[1].field_1.value);
    NullableValue<capnproto_test::capnp::test::TestInterface::Client>::
    emplace<capnproto_test::capnp::test::TestInterface::Client>
              ((NullableValue<capnproto_test::capnp::test::TestInterface::Client> *)(output + 1),
               (Client *)local_30);
    Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_30 + 8));
  }
  else {
    NullableValue<capnproto_test::capnp::test::TestInterface::Client>::operator=
              ((NullableValue<capnproto_test::capnp::test::TestInterface::Client> *)(output + 1),
               (void *)0x0);
  }
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }